

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureLogonSequenceNumberTooHigh_FIX40_ResendSentHelper::
~initiatorFixtureLogonSequenceNumberTooHigh_FIX40_ResendSentHelper
          (initiatorFixtureLogonSequenceNumberTooHigh_FIX40_ResendSentHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LogonSequenceNumberTooHigh_FIX40_ResendSent) {
    startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
    endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
    startTime = UtcTimeOnly( startTimeStamp );
    endTime = UtcTimeOnly( endTimeStamp );

    SessionID sessionID( BeginString( "FIX.4.0" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

    TimeRange sessionTime( startTime, endTime, 0, 31);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX40.xml" );
    DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());

    std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);

    provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );
    provider.addApplicationDataDictionary(ApplVerID("20"), pDataDictionary);

    object = new Session( *this, factory, sessionID, provider,
        sessionTime, 1, 0 );
    object->setSenderDefaultApplVerID(ApplVerID("20"));
    object->setTargetDefaultApplVerID(ApplVerID("20"));


    FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
    sentLogon.getHeader().setField(BeginString("FIX.4.0"));
    object->send(sentLogon);
    object->next();
    object->logon();

    FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
    receivedLogon.getHeader().setField(BeginString("FIX.4.0"));
    receivedLogon.getHeader().setField(MsgSeqNum(50));
    object->next(receivedLogon, UtcTimeStamp());

    CHECK_EQUAL(4, object->getExpectedSenderNum());
    CHECK_EQUAL(1, object->getExpectedTargetNum());
}